

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interval.cpp
# Opt level: O1

Interval interval::neg(Interval i)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  
  iVar5 = i.first;
  uVar4 = (ulong)(uint)-iVar5;
  uVar3 = 0x80000000;
  if (iVar5 == 0x7fffffff && ((ulong)i & 0xffffffff00000000) == 0x7fffffff00000000) {
    uVar4 = 0x80000000;
  }
  else if ((ulong)i >> 0x20 != 0x7fffffff) {
    uVar1 = -i.second;
    uVar3 = -iVar5;
    uVar2 = uVar1;
    if (SBORROW4(uVar3,uVar1) == (int)(uVar3 + i.second) < 0) {
      uVar2 = uVar3;
      uVar3 = uVar1;
    }
    uVar4 = (ulong)uVar2;
  }
  return (Interval)((ulong)uVar3 | uVar4 << 0x20);
}

Assistant:

Interval interval::neg(Interval i) {
  Interval result;
  if (minf == lower(i) && pinf == upper(i)) {
    result = full();
  } else if (pinf == lower(i) && minf == upper(i)) {
    result = empty();
  } else if (minf == lower(i) && minf == upper(i)) {
    result = make(pinf, pinf);
  } else if (pinf == lower(i) && pinf == upper(i)) {
    result = make(minf, minf);
  } else if (pinf == upper(i)) {
    result = make(minf, -(lower(i)));
  } else if (minf == lower(i)) {
    result = make(-(upper(i)), pinf);
  } else {
    result = make(std::min(-(upper(i)),-(lower(i))), 
                  std::max(-(upper(i)),-(lower(i))));
  }
  return result;
}